

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Vector3 Vector3Reflect(Vector3 v,Vector3 normal)

{
  float fVar1;
  Vector3 VVar2;
  
  fVar1 = v.z * normal.z + v.x * normal.x + v.y * normal.y;
  VVar2.x = v.x + normal.x * -2.0 * fVar1;
  VVar2.y = normal.y * -2.0 * fVar1 + v.y;
  VVar2.z = v.z + normal.z * -2.0 * fVar1;
  return VVar2;
}

Assistant:

RMDEF Vector3 Vector3Reflect(Vector3 v, Vector3 normal)
{
    // I is the original vector
    // N is the normal of the incident plane
    // R = I - (2*N*( DotProduct[ I,N] ))

    Vector3 result = { 0 };

    float dotProduct = Vector3DotProduct(v, normal);

    result.x = v.x - (2.0f*normal.x)*dotProduct;
    result.y = v.y - (2.0f*normal.y)*dotProduct;
    result.z = v.z - (2.0f*normal.z)*dotProduct;

    return result;
}